

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Sequence::ArchiveIN(ChFunction_Sequence *this,ChArchiveIn *marchive)

{
  ChNameValue<std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>_> local_38
  ;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Sequence>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_38._value = (list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)&this->start;
  local_38._name = "start";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = &this->functions;
  local_38._name = "functions";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFseqNode>(marchive,&local_38);
  return;
}

Assistant:

void ChFunction_Sequence::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Sequence>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(start);
    marchive >> CHNVP(functions);
}